

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O0

void __thiscall transaction_tests::tx_invalid::test_method(tx_invalid *this)

{
  string_view hex;
  Span<const_unsigned_char> sp;
  string_view jsondata;
  string_view hex_str;
  bool bVar1;
  bool bVar2;
  undefined1 uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  UniValue *pUVar7;
  long lVar8;
  mapped_type *pmVar9;
  string *map_prevout_values;
  long in_RDI;
  long in_FS_OFFSET;
  uint flags_excluding_one;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range3_1;
  uint flags;
  type *flag;
  type *name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *__range3;
  uint verify_flags;
  UniValue *vinput;
  UniValue *input;
  uint inpIdx;
  bool fValid;
  UniValue *test;
  uint idx;
  iterator __end3_1;
  iterator __begin3_1;
  iterator __end3;
  iterator __begin3;
  DataStream stream;
  PrecomputedTransactionData txdata;
  TxValidationState state;
  CTransaction tx;
  string transaction;
  COutPoint outpoint;
  UniValue inputs;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  mapprevOutValues;
  map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
  mapprevOutScriptPubKeys;
  string strTest;
  UniValue tests;
  PrecomputedTransactionData *in_stack_fffffffffffff3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  undefined7 in_stack_fffffffffffff3e0;
  undefined1 in_stack_fffffffffffff3e7;
  COutPoint *in_stack_fffffffffffff3e8;
  undefined4 in_stack_fffffffffffff3f0;
  int in_stack_fffffffffffff3f4;
  key_type *in_stack_fffffffffffff3f8;
  PrecomputedTransactionData *in_stack_fffffffffffff400;
  undefined6 in_stack_fffffffffffff408;
  undefined1 in_stack_fffffffffffff40e;
  undefined1 in_stack_fffffffffffff40f;
  CTransaction *in_stack_fffffffffffff410;
  PrecomputedTransactionData *in_stack_fffffffffffff418;
  undefined7 in_stack_fffffffffffff420;
  undefined1 in_stack_fffffffffffff427;
  long in_stack_fffffffffffff428;
  undefined4 in_stack_fffffffffffff430;
  uint in_stack_fffffffffffff434;
  uint in_stack_fffffffffffff438;
  undefined4 in_stack_fffffffffffff43c;
  lazy_ostream *in_stack_fffffffffffff440;
  PrecomputedTransactionData *in_stack_fffffffffffff448;
  undefined7 in_stack_fffffffffffff450;
  undefined1 in_stack_fffffffffffff457;
  PrecomputedTransactionData *in_stack_fffffffffffff4d8;
  undefined7 in_stack_fffffffffffff4e0;
  PrecomputedTransactionData *txdata_00;
  uint in_stack_fffffffffffff4f4;
  undefined7 in_stack_fffffffffffff508;
  undefined1 in_stack_fffffffffffff50f;
  string *in_stack_fffffffffffff538;
  undefined4 in_stack_fffffffffffff560;
  int in_stack_fffffffffffff564;
  CTransaction *in_stack_fffffffffffff568;
  uint local_94c;
  uint local_924;
  const_string local_918 [3];
  lazy_ostream local_8e8 [2];
  assertion_result local_8c8 [2];
  _Base_ptr local_890;
  _Base_ptr local_888;
  const_string local_880 [7];
  lazy_ostream local_810 [2];
  assertion_result local_7f0 [2];
  const_string local_7b8 [7];
  lazy_ostream local_748 [2];
  assertion_result local_728 [2];
  _Base_ptr local_6f0;
  _Base_ptr local_6e8;
  const_string local_6e0 [3];
  lazy_ostream local_6b0 [2];
  assertion_result local_690 [2];
  const_string local_658 [3];
  lazy_ostream local_628 [2];
  assertion_result local_608 [2];
  const_string local_5d0;
  lazy_ostream local_5c0 [2];
  assertion_result local_5a0 [4];
  undefined1 local_540 [32];
  const_string local_520 [3];
  lazy_ostream local_4f0 [2];
  assertion_result local_4d0 [2];
  const_string local_498 [3];
  lazy_ostream local_468 [2];
  assertion_result local_448 [2];
  undefined8 local_410;
  char *local_408;
  undefined1 local_288 [232];
  string local_1a0 [9];
  UniValue local_80;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_410 = 0xd0a4;
  local_408 = 
  "[\n[\"The following are deserialized transactions which are invalid.\"],\n[\"They are in the form\"],\n[\"[[[prevout hash, prevout index, prevout scriptPubKey, amount?], [input 2], ...],\"],\n[\"serializedTransaction, verifyFlags]\"],\n[\"Use BADTX for verifyFlags if it is expected to fail CheckTransaction()\"],\n[\"Objects that are only a single string (like this one) are ignored\"],\n\n[\"0e1b5688cf179cd9f7cbda1fac0090f6e684bbf8cd946660120197c3f3681809 but with extra junk appended to the end of the scriptPubKey\"],\n[[[\"6ca7ec7b1847f6bdbd737176050e6a08d66ccd55bb94ad24f4018024107a5827\", 0, \"0x41 0x043b640e983c9690a14c039a2037ecc3467b27a0dcd58f19d76c7bc118d09fec45adc5370a1c5bf8067ca9f5557a4cf885fdb0fe0dcc9c3a7137226106fbc779a5 CHECKSIG VERIFY 1\"]],\n\"010000000127587a10248001f424ad94bb55cd6cd6086a0e05767173bdbdf647187beca76c000000004948304502201b822ad10d6adc1a341ae8835be3f70a25201bbff31f59cbb9c5353a5f0eca18022100ea7b2f7074e9aa9cf70aa8d0ffee13e6b45dddabf1ab961bda378bcdb778fa4701ffffffff0100f2052a010000001976a914fc50c5907d86fed474ba5ce8b12a66e0a4c139d888ac00000000\", \"NONE\"],\n\n[\"This is the nearly-standard transaction with CHECKSIGVERIFY 1 instead of CHECKSIG from tx_valid.json\"],\n[\"but with the signature duplicated in the scriptPubKey with a non-standard pushdata prefix\"],\n[\"See FindAndDelete, which will only remove if it uses the same pushdata prefix as is standard\"],\n[[[\"0000000000000000000000000000000000000000000000000000000000000100\", 0, \"DUP HASH160 0x14 0x5b6462475454710f3c22f5fdf0b40704c92f25c3 EQUALVERIFY CHECKSIGVERIFY 1 0x4c 0x47 0x3044022067288ea50aa799543a536ff9306f8e1cba05b9c6b10951175b924f96732555ed022026d7b5265f38d21541519e4a1e55044d5b9e17e15cdbaf29ae3792e99e883e7a01\"]],\n\"01000000010001000000000000000000000000000000000000000000000000000000000000000000006a473044022067288ea50aa799543a536ff9306f8e1cba05b9c6b10951175b924f96732555ed022026d7b5265f38d21541519e4a1e55044d5b9e17e15cdbaf29ae3792e99e883e7a012103ba8c8b86dea131c22ab967e6dd99bdae8eff7a1f75a2c35f1f944109e3fe5e22ffffffff010000000000000000015100000000\", \"NONE\"],\n\n[\"Same as ab..." /* TRUNCATED STRING LITERAL */
  ;
  jsondata._M_len._4_4_ = in_stack_fffffffffffff43c;
  jsondata._M_len._0_4_ = in_stack_fffffffffffff438;
  jsondata._M_str = (char *)in_stack_fffffffffffff440;
  read_json(jsondata);
  local_924 = 0;
  do {
    sVar6 = UniValue::size((UniValue *)in_stack_fffffffffffff3d8);
    if (sVar6 <= local_924) {
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffff3d8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      __stack_chk_fail();
    }
    pUVar7 = UniValue::operator[]
                       ((UniValue *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                        (size_t)in_stack_fffffffffffff3e8);
    UniValue::write_abi_cxx11_(&local_80,(int)pUVar7,(void *)0x0,0);
    UniValue::operator[]
              ((UniValue *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
               (size_t)in_stack_fffffffffffff3e8);
    bVar1 = UniValue::isArray((UniValue *)in_stack_fffffffffffff3d8);
    if (bVar1) {
      sVar6 = UniValue::size((UniValue *)in_stack_fffffffffffff3d8);
      if (sVar6 == 3) {
        UniValue::operator[]
                  ((UniValue *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                   (size_t)in_stack_fffffffffffff3e8);
        bVar1 = UniValue::isStr((UniValue *)in_stack_fffffffffffff3d8);
        if (bVar1) {
          UniValue::operator[]
                    ((UniValue *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                     (size_t)in_stack_fffffffffffff3e8);
          bVar1 = UniValue::isStr((UniValue *)in_stack_fffffffffffff3d8);
          if (bVar1) {
            std::
            map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
            ::map((map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                   *)in_stack_fffffffffffff3d8);
            std::
            map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
            ::map((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                   *)in_stack_fffffffffffff3d8);
            UniValue::operator[]
                      ((UniValue *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                       (size_t)in_stack_fffffffffffff3e8);
            UniValue::get_array((UniValue *)
                                CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0));
            UniValue::UniValue((UniValue *)
                               CONCAT17(in_stack_fffffffffffff40f,
                                        CONCAT16(in_stack_fffffffffffff40e,in_stack_fffffffffffff408
                                                )),(UniValue *)in_stack_fffffffffffff400);
            bVar1 = true;
            for (local_94c = 0; sVar6 = UniValue::size((UniValue *)in_stack_fffffffffffff3d8),
                local_94c < sVar6; local_94c = local_94c + 1) {
              UniValue::operator[]
                        ((UniValue *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                         (size_t)in_stack_fffffffffffff3e8);
              bVar2 = UniValue::isArray((UniValue *)in_stack_fffffffffffff3d8);
              if (!bVar2) {
                bVar1 = false;
                break;
              }
              UniValue::get_array((UniValue *)
                                  CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0));
              sVar6 = UniValue::size((UniValue *)in_stack_fffffffffffff3d8);
              if ((sVar6 < 3) ||
                 (sVar6 = UniValue::size((UniValue *)in_stack_fffffffffffff3d8), 4 < sVar6)) {
                bVar1 = false;
                break;
              }
              UniValue::operator[]
                        ((UniValue *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                         (size_t)in_stack_fffffffffffff3e8);
              UniValue::get_str_abi_cxx11_
                        ((UniValue *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0));
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff3f8);
              hex._M_str = (char *)in_stack_fffffffffffff400;
              hex._M_len = (size_t)in_stack_fffffffffffff3f8;
              transaction_identifier<false>::FromHex(hex);
              std::optional<transaction_identifier<false>_>::value
                        ((optional<transaction_identifier<false>_> *)in_stack_fffffffffffff3e8);
              in_stack_fffffffffffff568 =
                   (CTransaction *)
                   UniValue::operator[]
                             ((UniValue *)
                              CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                              (size_t)in_stack_fffffffffffff3e8);
              in_stack_fffffffffffff564 =
                   UniValue::getInt<int>
                             ((UniValue *)
                              CONCAT44(in_stack_fffffffffffff434,in_stack_fffffffffffff430));
              COutPoint::COutPoint
                        (in_stack_fffffffffffff3e8,
                         (Txid *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                         (uint32_t)((ulong)in_stack_fffffffffffff3d8 >> 0x20));
              UniValue::operator[]
                        ((UniValue *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                         (size_t)in_stack_fffffffffffff3e8);
              UniValue::get_str_abi_cxx11_
                        ((UniValue *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0));
              ParseScript(in_stack_fffffffffffff538);
              std::
              map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
              ::operator[]((map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                            *)in_stack_fffffffffffff400,in_stack_fffffffffffff3f8);
              in_stack_fffffffffffff538 = local_1a0;
              CScript::operator=((CScript *)in_stack_fffffffffffff3e8,
                                 (CScript *)
                                 CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0));
              CScript::~CScript((CScript *)in_stack_fffffffffffff3d8);
              sVar6 = UniValue::size((UniValue *)in_stack_fffffffffffff3d8);
              if (3 < sVar6) {
                UniValue::operator[]
                          ((UniValue *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0)
                           ,(size_t)in_stack_fffffffffffff3e8);
                lVar8 = UniValue::getInt<long>
                                  ((UniValue *)
                                   CONCAT44(in_stack_fffffffffffff43c,in_stack_fffffffffffff438));
                pmVar9 = std::
                         map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                         ::operator[]((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                       *)in_stack_fffffffffffff400,in_stack_fffffffffffff3f8);
                *pmVar9 = lVar8;
              }
            }
            if (bVar1) {
              pUVar7 = UniValue::operator[]
                                 ((UniValue *)
                                  CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                                  (size_t)in_stack_fffffffffffff3e8);
              map_prevout_values =
                   UniValue::get_str_abi_cxx11_
                             ((UniValue *)
                              CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0));
              std::__cxx11::string::string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff418);
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff3f8);
              hex_str._M_str = (char *)in_stack_fffffffffffff448;
              hex_str._M_len = (size_t)in_stack_fffffffffffff440;
              ParseHex<unsigned_char>(hex_str);
              Span<unsigned_char_const>::
              Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((Span<const_unsigned_char> *)in_stack_fffffffffffff3e8,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                         in_stack_fffffffffffff3d8);
              sp.m_size._0_6_ = in_stack_fffffffffffff408;
              sp.m_data = (uchar *)in_stack_fffffffffffff400;
              sp.m_size._6_1_ = in_stack_fffffffffffff40e;
              sp.m_size._7_1_ = in_stack_fffffffffffff40f;
              DataStream::DataStream((DataStream *)in_stack_fffffffffffff3e8,sp);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffff3e8);
              CTransaction::CTransaction<DataStream>
                        ((CTransaction *)(local_288 + 0x48),&::TX_WITH_WITNESS,local_540);
              txdata_00 = (PrecomputedTransactionData *)local_288;
              TxValidationState::TxValidationState((TxValidationState *)in_stack_fffffffffffff3d8);
              bVar1 = CheckTransaction(in_stack_fffffffffffff568,
                                       (TxValidationState *)
                                       CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560)
                                      );
              in_stack_fffffffffffff4f4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff4f4);
              if ((!bVar1) ||
                 (uVar3 = ValidationState<TxValidationResult>::IsInvalid
                                    ((ValidationState<TxValidationResult> *)
                                     in_stack_fffffffffffff3d8), (bool)uVar3)) {
                do {
                  in_stack_fffffffffffff4d8 = boost::unit_test::(anonymous_namespace)::unit_test_log
                  ;
                  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                            ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                             (pointer)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                             (unsigned_long)in_stack_fffffffffffff3d8);
                  boost::unit_test::basic_cstring<const_char>::basic_cstring
                            ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            ((unit_test_log_t *)in_stack_fffffffffffff418,
                             (const_string *)in_stack_fffffffffffff410,
                             CONCAT17(in_stack_fffffffffffff40f,
                                      CONCAT16(in_stack_fffffffffffff40e,in_stack_fffffffffffff408))
                             ,(const_string *)in_stack_fffffffffffff400);
                  UniValue::operator[]
                            ((UniValue *)
                             CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                             (size_t)in_stack_fffffffffffff3e8);
                  UniValue::get_str_abi_cxx11_
                            ((UniValue *)
                             CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0));
                  std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff3e8,
                                  (char *)CONCAT17(in_stack_fffffffffffff3e7,
                                                   in_stack_fffffffffffff3e0));
                  boost::test_tools::assertion_result::assertion_result
                            ((assertion_result *)in_stack_fffffffffffff3e8,
                             (bool)in_stack_fffffffffffff3e7);
                  boost::unit_test::lazy_ostream::instance();
                  boost::unit_test::operator<<
                            ((lazy_ostream *)
                             CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff3d8);
                  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                            ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                             (pointer)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                             (unsigned_long)in_stack_fffffffffffff3d8);
                  in_stack_fffffffffffff3d8 = (PrecomputedTransactionData *)0x0;
                  boost::test_tools::tt_detail::report_assertion
                            (local_5a0,local_5c0,&local_5d0,0x14e,CHECK);
                  boost::unit_test::
                  lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  ::~lazy_ostream_impl
                            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              *)in_stack_fffffffffffff3d8);
                  boost::test_tools::assertion_result::~assertion_result
                            ((assertion_result *)in_stack_fffffffffffff3d8);
                  bVar1 = boost::test_tools::tt_detail::dummy_cond();
                } while (bVar1);
              }
              else {
                PrecomputedTransactionData::PrecomputedTransactionData<CTransaction>
                          (in_stack_fffffffffffff418,in_stack_fffffffffffff410);
                UniValue::operator[]
                          ((UniValue *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0)
                           ,(size_t)in_stack_fffffffffffff3e8);
                UniValue::get_str_abi_cxx11_
                          ((UniValue *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0)
                          );
                std::__cxx11::string::string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff418);
                uVar4 = ParseScriptFlags((string *)
                                         CONCAT17(in_stack_fffffffffffff457,
                                                  in_stack_fffffffffffff450));
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff3d8);
                uVar5 = FillFlags((uint)in_stack_fffffffffffff3d8);
                if (uVar4 != uVar5) {
                  do {
                    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                               (pointer)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0
                                                ),(unsigned_long)in_stack_fffffffffffff3d8);
                    boost::unit_test::basic_cstring<const_char>::basic_cstring
                              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              ((unit_test_log_t *)in_stack_fffffffffffff418,
                               (const_string *)in_stack_fffffffffffff410,
                               CONCAT17(in_stack_fffffffffffff40f,
                                        CONCAT16(in_stack_fffffffffffff40e,in_stack_fffffffffffff408
                                                )),(const_string *)in_stack_fffffffffffff400);
                    boost::test_tools::assertion_result::assertion_result
                              ((assertion_result *)in_stack_fffffffffffff3e8,
                               (bool)in_stack_fffffffffffff3e7);
                    boost::unit_test::lazy_ostream::instance();
                    boost::unit_test::operator<<
                              ((lazy_ostream *)
                               CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                               (char (*) [17])in_stack_fffffffffffff3d8);
                    boost::unit_test::operator<<
                              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[17],_const_char_(&)[17]>
                                *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff3d8);
                    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                               (pointer)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0
                                                ),(unsigned_long)in_stack_fffffffffffff3d8);
                    in_stack_fffffffffffff3d8 = (PrecomputedTransactionData *)0x0;
                    boost::test_tools::tt_detail::report_assertion
                              (local_608,local_628,local_658,0x157,CHECK);
                    boost::unit_test::
                    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[17],_const_char_(&)[17]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    ::~lazy_ostream_impl
                              ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[17],_const_char_(&)[17]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                *)in_stack_fffffffffffff3d8);
                    boost::unit_test::
                    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[17],_const_char_(&)[17]>
                    ::~lazy_ostream_impl
                              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[17],_const_char_(&)[17]>
                                *)in_stack_fffffffffffff3d8);
                    boost::test_tools::assertion_result::~assertion_result
                              ((assertion_result *)in_stack_fffffffffffff3d8);
                    bVar1 = boost::test_tools::tt_detail::dummy_cond();
                  } while (bVar1);
                }
                do {
                  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                            ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                             (pointer)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                             (unsigned_long)in_stack_fffffffffffff3d8);
                  boost::unit_test::basic_cstring<const_char>::basic_cstring
                            ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            ((unit_test_log_t *)in_stack_fffffffffffff418,
                             (const_string *)in_stack_fffffffffffff410,
                             CONCAT17(in_stack_fffffffffffff40f,
                                      CONCAT16(in_stack_fffffffffffff40e,in_stack_fffffffffffff408))
                             ,(const_string *)in_stack_fffffffffffff400);
                  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((ulong)in_stack_fffffffffffff3d8 & 0xffffffff00000000);
                  CheckTxScripts((CTransaction *)
                                 CONCAT17(in_stack_fffffffffffff50f,in_stack_fffffffffffff508),
                                 (map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                                  *)pUVar7,
                                 (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                  *)map_prevout_values,in_stack_fffffffffffff4f4,txdata_00,
                                 (string *)CONCAT17(uVar3,in_stack_fffffffffffff4e0),
                                 SUB81((ulong)in_stack_fffffffffffff4d8 >> 0x38,0));
                  boost::test_tools::assertion_result::assertion_result
                            ((assertion_result *)in_stack_fffffffffffff3e8,
                             (bool)in_stack_fffffffffffff3e7);
                  boost::unit_test::lazy_ostream::instance();
                  boost::unit_test::operator<<
                            ((lazy_ostream *)
                             CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                             (char (*) [25])pbVar10);
                  boost::unit_test::operator<<
                            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>
                              *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                             pbVar10);
                  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                            ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                             (pointer)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                             (unsigned_long)pbVar10);
                  in_stack_fffffffffffff3d8 = (PrecomputedTransactionData *)0x0;
                  boost::test_tools::tt_detail::report_assertion
                            (local_690,local_6b0,local_6e0,0x15c,CHECK);
                  boost::unit_test::
                  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  ::~lazy_ostream_impl
                            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              *)in_stack_fffffffffffff3d8);
                  boost::unit_test::
                  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>::
                  ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>
                                      *)in_stack_fffffffffffff3d8);
                  boost::test_tools::assertion_result::~assertion_result
                            ((assertion_result *)in_stack_fffffffffffff3d8);
                  bVar1 = boost::test_tools::tt_detail::dummy_cond();
                } while (bVar1);
                local_6e8 = (_Base_ptr)
                            std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                     *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0)
                                   );
                local_6f0 = (_Base_ptr)
                            std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                   *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0));
                while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffff3e8,
                                               (_Self *)CONCAT17(in_stack_fffffffffffff3e7,
                                                                 in_stack_fffffffffffff3e0)),
                      ((bVar1 ^ 0xffU) & 1) != 0) {
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                               *)in_stack_fffffffffffff3d8);
                  std::get<0ul,std::__cxx11::string_const,unsigned_int>
                            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                              *)in_stack_fffffffffffff3d8);
                  std::get<1ul,std::__cxx11::string_const,unsigned_int>
                            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                              *)in_stack_fffffffffffff3d8);
                  FillFlags((uint)in_stack_fffffffffffff3d8);
                  pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((ulong)in_stack_fffffffffffff3d8 & 0xffffffff00000000);
                  in_stack_fffffffffffff457 =
                       CheckTxScripts((CTransaction *)
                                      CONCAT17(in_stack_fffffffffffff50f,in_stack_fffffffffffff508),
                                      (map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                                       *)pUVar7,
                                      (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                       *)map_prevout_values,in_stack_fffffffffffff4f4,txdata_00,
                                      (string *)CONCAT17(uVar3,in_stack_fffffffffffff4e0),
                                      SUB81((ulong)in_stack_fffffffffffff4d8 >> 0x38,0));
                  if (!(bool)in_stack_fffffffffffff457) {
                    do {
                      in_stack_fffffffffffff448 =
                           boost::unit_test::(anonymous_namespace)::unit_test_log;
                      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                                ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                                 (pointer)CONCAT17(in_stack_fffffffffffff3e7,
                                                   in_stack_fffffffffffff3e0),(unsigned_long)pbVar10
                                );
                      boost::unit_test::basic_cstring<const_char>::basic_cstring
                                ((basic_cstring<const_char> *)pbVar10);
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                ((unit_test_log_t *)in_stack_fffffffffffff418,
                                 (const_string *)in_stack_fffffffffffff410,
                                 CONCAT17(in_stack_fffffffffffff40f,
                                          CONCAT16(in_stack_fffffffffffff40e,
                                                   in_stack_fffffffffffff408)),
                                 (const_string *)in_stack_fffffffffffff400);
                      boost::test_tools::assertion_result::assertion_result
                                ((assertion_result *)in_stack_fffffffffffff3e8,
                                 (bool)in_stack_fffffffffffff3e7);
                      in_stack_fffffffffffff440 = boost::unit_test::lazy_ostream::instance();
                      boost::unit_test::operator<<
                                ((lazy_ostream *)
                                 CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                                 (char (*) [34])pbVar10);
                      boost::unit_test::operator<<
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[34],_const_char_(&)[34]>
                                  *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                                 pbVar10);
                      boost::unit_test::operator<<
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[34],_const_char_(&)[34]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                  *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                                 (char (*) [7])pbVar10);
                      boost::unit_test::operator<<
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[34],_const_char_(&)[34]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[7],_const_char_(&)[7]>
                                  *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                                 pbVar10);
                      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                                ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                                 (pointer)CONCAT17(in_stack_fffffffffffff3e7,
                                                   in_stack_fffffffffffff3e0),(unsigned_long)pbVar10
                                );
                      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0;
                      boost::test_tools::tt_detail::report_assertion
                                (local_728,local_748,local_7b8,0x163,CHECK);
                      boost::unit_test::
                      lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[34],_const_char_(&)[34]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[7],_const_char_(&)[7]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      ::~lazy_ostream_impl
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[34],_const_char_(&)[34]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[7],_const_char_(&)[7]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                  *)pbVar10);
                      boost::unit_test::
                      lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[34],_const_char_(&)[34]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[7],_const_char_(&)[7]>
                      ::~lazy_ostream_impl
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[34],_const_char_(&)[34]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[7],_const_char_(&)[7]>
                                  *)pbVar10);
                      boost::unit_test::
                      lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[34],_const_char_(&)[34]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      ::~lazy_ostream_impl
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[34],_const_char_(&)[34]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                  *)pbVar10);
                      boost::unit_test::
                      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[34],_const_char_(&)[34]>
                      ::~lazy_ostream_impl
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[34],_const_char_(&)[34]>
                                  *)pbVar10);
                      boost::test_tools::assertion_result::~assertion_result
                                ((assertion_result *)pbVar10);
                      bVar1 = boost::test_tools::tt_detail::dummy_cond();
                      in_stack_fffffffffffff43c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff43c);
                    } while (bVar1);
                  }
                  in_stack_fffffffffffff428 = in_RDI + 0x110;
                  in_stack_fffffffffffff434 = uVar4;
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)pbVar10);
                  RandomMixin<FastRandomContext>::randbits
                            ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff3f8,
                             in_stack_fffffffffffff3f4);
                  in_stack_fffffffffffff438 = FillFlags((uint)pbVar10);
                  in_stack_fffffffffffff3d8 =
                       (PrecomputedTransactionData *)((ulong)pbVar10 & 0xffffffff00000000);
                  in_stack_fffffffffffff427 =
                       CheckTxScripts((CTransaction *)
                                      CONCAT17(in_stack_fffffffffffff50f,in_stack_fffffffffffff508),
                                      (map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                                       *)pUVar7,
                                      (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                       *)map_prevout_values,in_stack_fffffffffffff4f4,txdata_00,
                                      (string *)CONCAT17(uVar3,in_stack_fffffffffffff4e0),
                                      SUB81((ulong)in_stack_fffffffffffff4d8 >> 0x38,0));
                  if (!(bool)in_stack_fffffffffffff427) {
                    do {
                      in_stack_fffffffffffff418 =
                           boost::unit_test::(anonymous_namespace)::unit_test_log;
                      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                                ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                                 (pointer)CONCAT17(in_stack_fffffffffffff3e7,
                                                   in_stack_fffffffffffff3e0),
                                 (unsigned_long)in_stack_fffffffffffff3d8);
                      boost::unit_test::basic_cstring<const_char>::basic_cstring
                                ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                ((unit_test_log_t *)in_stack_fffffffffffff418,
                                 (const_string *)in_stack_fffffffffffff410,
                                 CONCAT17(in_stack_fffffffffffff40f,
                                          CONCAT16(in_stack_fffffffffffff40e,
                                                   in_stack_fffffffffffff408)),
                                 (const_string *)in_stack_fffffffffffff400);
                      boost::test_tools::assertion_result::assertion_result
                                ((assertion_result *)in_stack_fffffffffffff3e8,
                                 (bool)in_stack_fffffffffffff3e7);
                      in_stack_fffffffffffff410 =
                           (CTransaction *)boost::unit_test::lazy_ostream::instance();
                      boost::unit_test::operator<<
                                ((lazy_ostream *)
                                 CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                                 (char (*) [42])in_stack_fffffffffffff3d8);
                      boost::unit_test::operator<<
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[42],_const_char_(&)[42]>
                                  *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff3d8);
                      boost::unit_test::operator<<
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[42],_const_char_(&)[42]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                  *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                                 (char (*) [3])in_stack_fffffffffffff3d8);
                      boost::unit_test::operator<<
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[42],_const_char_(&)[42]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
                                  *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff3d8);
                      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                                ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                                 (pointer)CONCAT17(in_stack_fffffffffffff3e7,
                                                   in_stack_fffffffffffff3e0),
                                 (unsigned_long)in_stack_fffffffffffff3d8);
                      in_stack_fffffffffffff3d8 = (PrecomputedTransactionData *)0x0;
                      boost::test_tools::tt_detail::report_assertion
                                (local_7f0,local_810,local_880,0x168,CHECK);
                      boost::unit_test::
                      lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[42],_const_char_(&)[42]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      ::~lazy_ostream_impl
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[42],_const_char_(&)[42]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                  *)in_stack_fffffffffffff3d8);
                      boost::unit_test::
                      lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[42],_const_char_(&)[42]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
                      ::~lazy_ostream_impl
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[42],_const_char_(&)[42]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
                                  *)in_stack_fffffffffffff3d8);
                      boost::unit_test::
                      lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[42],_const_char_(&)[42]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      ::~lazy_ostream_impl
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[42],_const_char_(&)[42]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                  *)in_stack_fffffffffffff3d8);
                      boost::unit_test::
                      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[42],_const_char_(&)[42]>
                      ::~lazy_ostream_impl
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[42],_const_char_(&)[42]>
                                  *)in_stack_fffffffffffff3d8);
                      boost::test_tools::assertion_result::~assertion_result
                                ((assertion_result *)in_stack_fffffffffffff3d8);
                      in_stack_fffffffffffff40f = boost::test_tools::tt_detail::dummy_cond();
                    } while ((bool)in_stack_fffffffffffff40f);
                  }
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                  ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                                *)in_stack_fffffffffffff3d8);
                }
                ExcludeIndividualFlags((uint)((ulong)in_stack_fffffffffffff428 >> 0x20));
                local_888 = (_Base_ptr)
                            std::
                            set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            ::begin((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                     *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0)
                                   );
                local_890 = (_Base_ptr)
                            std::
                            set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            ::end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0));
                while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffff3e8,
                                               (_Self *)CONCAT17(in_stack_fffffffffffff3e7,
                                                                 in_stack_fffffffffffff3e0)),
                      ((bVar1 ^ 0xffU) & 1) != 0) {
                  std::_Rb_tree_const_iterator<unsigned_int>::operator*
                            ((_Rb_tree_const_iterator<unsigned_int> *)in_stack_fffffffffffff3d8);
                  in_stack_fffffffffffff3d8 =
                       (PrecomputedTransactionData *)
                       CONCAT44((int)((ulong)in_stack_fffffffffffff3d8 >> 0x20),1);
                  in_stack_fffffffffffff40e =
                       CheckTxScripts((CTransaction *)
                                      CONCAT17(in_stack_fffffffffffff50f,in_stack_fffffffffffff508),
                                      (map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                                       *)pUVar7,
                                      (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                       *)map_prevout_values,in_stack_fffffffffffff4f4,txdata_00,
                                      (string *)CONCAT17(uVar3,in_stack_fffffffffffff4e0),
                                      SUB81((ulong)in_stack_fffffffffffff4d8 >> 0x38,0));
                  if (!(bool)in_stack_fffffffffffff40e) {
                    do {
                      in_stack_fffffffffffff400 =
                           boost::unit_test::(anonymous_namespace)::unit_test_log;
                      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                                ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                                 (pointer)CONCAT17(in_stack_fffffffffffff3e7,
                                                   in_stack_fffffffffffff3e0),
                                 (unsigned_long)in_stack_fffffffffffff3d8);
                      boost::unit_test::basic_cstring<const_char>::basic_cstring
                                ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                ((unit_test_log_t *)in_stack_fffffffffffff418,
                                 (const_string *)in_stack_fffffffffffff410,
                                 CONCAT17(in_stack_fffffffffffff40f,
                                          CONCAT16(in_stack_fffffffffffff40e,
                                                   in_stack_fffffffffffff408)),
                                 (const_string *)in_stack_fffffffffffff400);
                      boost::test_tools::assertion_result::assertion_result
                                ((assertion_result *)in_stack_fffffffffffff3e8,
                                 (bool)in_stack_fffffffffffff3e7);
                      in_stack_fffffffffffff3f8 =
                           (key_type *)boost::unit_test::lazy_ostream::instance();
                      boost::unit_test::operator<<
                                ((lazy_ostream *)
                                 CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                                 (char (*) [21])in_stack_fffffffffffff3d8);
                      boost::unit_test::operator<<
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>
                                  *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff3d8);
                      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                                ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                                 (pointer)CONCAT17(in_stack_fffffffffffff3e7,
                                                   in_stack_fffffffffffff3e0),
                                 (unsigned_long)in_stack_fffffffffffff3d8);
                      in_stack_fffffffffffff3d8 = (PrecomputedTransactionData *)0x0;
                      boost::test_tools::tt_detail::report_assertion
                                (local_8c8,local_8e8,local_918,0x16f,CHECK);
                      boost::unit_test::
                      lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      ::~lazy_ostream_impl
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                  *)in_stack_fffffffffffff3d8);
                      boost::unit_test::
                      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>
                      ::~lazy_ostream_impl
                                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>
                                  *)in_stack_fffffffffffff3d8);
                      boost::test_tools::assertion_result::~assertion_result
                                ((assertion_result *)in_stack_fffffffffffff3d8);
                      bVar1 = boost::test_tools::tt_detail::dummy_cond();
                      in_stack_fffffffffffff3f4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff3f4);
                    } while (bVar1);
                  }
                  std::_Rb_tree_const_iterator<unsigned_int>::operator++
                            ((_Rb_tree_const_iterator<unsigned_int> *)in_stack_fffffffffffff3d8);
                }
                std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                          ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)in_stack_fffffffffffff3d8);
                PrecomputedTransactionData::~PrecomputedTransactionData(in_stack_fffffffffffff3d8);
              }
              TxValidationState::~TxValidationState((TxValidationState *)in_stack_fffffffffffff3d8);
              CTransaction::~CTransaction((CTransaction *)in_stack_fffffffffffff3d8);
              DataStream::~DataStream((DataStream *)in_stack_fffffffffffff3d8);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff3d8);
            }
            else {
              do {
                boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                          ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                           (pointer)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                           (unsigned_long)in_stack_fffffffffffff3d8);
                boost::unit_test::basic_cstring<const_char>::basic_cstring
                          ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
                boost::unit_test::unit_test_log_t::set_checkpoint
                          ((unit_test_log_t *)in_stack_fffffffffffff418,
                           (const_string *)in_stack_fffffffffffff410,
                           CONCAT17(in_stack_fffffffffffff40f,
                                    CONCAT16(in_stack_fffffffffffff40e,in_stack_fffffffffffff408)),
                           (const_string *)in_stack_fffffffffffff400);
                boost::test_tools::assertion_result::assertion_result
                          ((assertion_result *)in_stack_fffffffffffff3e8,
                           (bool)in_stack_fffffffffffff3e7);
                boost::unit_test::lazy_ostream::instance();
                boost::unit_test::operator<<
                          ((lazy_ostream *)
                           CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                           (char (*) [11])in_stack_fffffffffffff3d8);
                boost::unit_test::operator<<
                          ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>
                            *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff3d8);
                boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                          ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                           (pointer)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                           (unsigned_long)in_stack_fffffffffffff3d8);
                in_stack_fffffffffffff3d8 = (PrecomputedTransactionData *)0x0;
                boost::test_tools::tt_detail::report_assertion
                          (local_4d0,local_4f0,local_520,0x144,CHECK);
                boost::unit_test::
                lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                ::~lazy_ostream_impl
                          ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                            *)in_stack_fffffffffffff3d8);
                boost::unit_test::
                lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>::
                ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>
                                    *)in_stack_fffffffffffff3d8);
                boost::test_tools::assertion_result::~assertion_result
                          ((assertion_result *)in_stack_fffffffffffff3d8);
                in_stack_fffffffffffff50f = boost::test_tools::tt_detail::dummy_cond();
              } while ((bool)in_stack_fffffffffffff50f);
            }
            UniValue::~UniValue((UniValue *)in_stack_fffffffffffff3d8);
            std::
            map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
            ::~map((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    *)in_stack_fffffffffffff3d8);
            std::
            map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
            ::~map((map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                    *)in_stack_fffffffffffff3d8);
            goto LAB_00b31867;
          }
        }
      }
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                   (pointer)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                   (unsigned_long)in_stack_fffffffffffff3d8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffff418,
                   (const_string *)in_stack_fffffffffffff410,
                   CONCAT17(in_stack_fffffffffffff40f,
                            CONCAT16(in_stack_fffffffffffff40e,in_stack_fffffffffffff408)),
                   (const_string *)in_stack_fffffffffffff400);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffff3e8,(bool)in_stack_fffffffffffff3e7);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                   (char (*) [11])in_stack_fffffffffffff3d8);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>
                    *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff3d8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8,
                   (pointer)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                   (unsigned_long)in_stack_fffffffffffff3d8);
        in_stack_fffffffffffff3d8 = (PrecomputedTransactionData *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_448,local_468,local_498,0x127,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffff3d8);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>
                            *)in_stack_fffffffffffff3d8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff3d8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
LAB_00b31867:
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff3d8);
    local_924 = local_924 + 1;
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(tx_invalid)
{
    // Read tests from test/data/tx_invalid.json
    UniValue tests = read_json(json_tests::tx_invalid);

    for (unsigned int idx = 0; idx < tests.size(); idx++) {
        const UniValue& test = tests[idx];
        std::string strTest = test.write();
        if (test[0].isArray())
        {
            if (test.size() != 3 || !test[1].isStr() || !test[2].isStr())
            {
                BOOST_ERROR("Bad test: " << strTest);
                continue;
            }

            std::map<COutPoint, CScript> mapprevOutScriptPubKeys;
            std::map<COutPoint, int64_t> mapprevOutValues;
            UniValue inputs = test[0].get_array();
            bool fValid = true;
            for (unsigned int inpIdx = 0; inpIdx < inputs.size(); inpIdx++) {
                const UniValue& input = inputs[inpIdx];
                if (!input.isArray()) {
                    fValid = false;
                    break;
                }
                const UniValue& vinput = input.get_array();
                if (vinput.size() < 3 || vinput.size() > 4)
                {
                    fValid = false;
                    break;
                }
                COutPoint outpoint{Txid::FromHex(vinput[0].get_str()).value(), uint32_t(vinput[1].getInt<int>())};
                mapprevOutScriptPubKeys[outpoint] = ParseScript(vinput[2].get_str());
                if (vinput.size() >= 4)
                {
                    mapprevOutValues[outpoint] = vinput[3].getInt<int64_t>();
                }
            }
            if (!fValid)
            {
                BOOST_ERROR("Bad test: " << strTest);
                continue;
            }

            std::string transaction = test[1].get_str();
            DataStream stream(ParseHex(transaction));
            CTransaction tx(deserialize, TX_WITH_WITNESS, stream);

            TxValidationState state;
            if (!CheckTransaction(tx, state) || state.IsInvalid()) {
                BOOST_CHECK_MESSAGE(test[2].get_str() == "BADTX", strTest);
                continue;
            }

            PrecomputedTransactionData txdata(tx);
            unsigned int verify_flags = ParseScriptFlags(test[2].get_str());

            // Check that the test gives a valid combination of flags (otherwise VerifyScript will throw). Don't edit the flags.
            if (verify_flags != FillFlags(verify_flags)) {
                BOOST_ERROR("Bad test flags: " << strTest);
            }

            // Not using FillFlags() in the main test, in order to detect invalid verifyFlags combination
            BOOST_CHECK_MESSAGE(CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, verify_flags, txdata, strTest, /*expect_valid=*/false),
                                "Tx unexpectedly passed: " << strTest);

            // Backwards compatibility of script verification flags: Adding any flag(s) should not validate an invalid transaction
            for (const auto& [name, flag] : mapFlagNames) {
                unsigned int flags = FillFlags(verify_flags | flag);
                // Adding individual flags
                if (!CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, flags, txdata, strTest, /*expect_valid=*/false)) {
                    BOOST_ERROR("Tx unexpectedly passed with flag " << name << " set: " << strTest);
                }
                // Adding random combinations of flags
                flags = FillFlags(verify_flags | (unsigned int)m_rng.randbits(mapFlagNames.size()));
                if (!CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, flags, txdata, strTest, /*expect_valid=*/false)) {
                    BOOST_ERROR("Tx unexpectedly passed with random flags " << name << ": " << strTest);
                }
            }

            // Check that flags are minimal: transaction should succeed if any set flags are unset.
            for (auto flags_excluding_one : ExcludeIndividualFlags(verify_flags)) {
                if (!CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, flags_excluding_one, txdata, strTest, /*expect_valid=*/true)) {
                    BOOST_ERROR("Too many flags set: " << strTest);
                }
            }
        }
    }
}